

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O1

Nwk_Grf_t * Nwk_ManGraphAlloc(int nVertsMax)

{
  uint uVar1;
  Nwk_Grf_t *__s;
  Nwk_Edg_t **ppNVar2;
  Aig_MmFixed_t *pAVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  uint nEntriesMax;
  
  __s = (Nwk_Grf_t *)malloc(0xe0);
  memset(__s,0,0xe0);
  __s->nVertsMax = nVertsMax;
  uVar7 = nVertsMax * 3 - 1;
  while( true ) {
    do {
      nEntriesMax = uVar7 + 1;
      uVar1 = uVar7 & 1;
      uVar7 = nEntriesMax;
    } while (uVar1 != 0);
    if (nEntriesMax < 9) break;
    iVar6 = 5;
    while (nEntriesMax % (iVar6 - 2U) != 0) {
      uVar1 = iVar6 * iVar6;
      iVar6 = iVar6 + 2;
      if (nEntriesMax < uVar1) goto LAB_004e78f1;
    }
  }
LAB_004e78f1:
  __s->nEdgeHash = nEntriesMax;
  ppNVar2 = (Nwk_Edg_t **)calloc((long)(int)nEntriesMax,8);
  __s->pEdgeHash = ppNVar2;
  pAVar3 = Aig_MmFixedStart(0x10,nEntriesMax);
  __s->pMemEdges = pAVar3;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(4000);
  pVVar4->pArray = piVar5;
  __s->vPairs = pVVar4;
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates the graph.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Nwk_Grf_t * Nwk_ManGraphAlloc( int nVertsMax )
{
    Nwk_Grf_t * p;
    p = ABC_ALLOC( Nwk_Grf_t, 1 );
    memset( p, 0, sizeof(Nwk_Grf_t) );
    p->nVertsMax = nVertsMax;
    p->nEdgeHash = Abc_PrimeCudd( 3 * nVertsMax );
    p->pEdgeHash = ABC_CALLOC( Nwk_Edg_t *, p->nEdgeHash );
    p->pMemEdges = Aig_MmFixedStart( sizeof(Nwk_Edg_t), p->nEdgeHash );
    p->vPairs    = Vec_IntAlloc( 1000 );
    return p;
}